

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

int kwsysSystem_Shell__GetArgumentSize(char *in,int isUnix,int flags)

{
  int iVar1;
  size_t sVar2;
  int local_2c;
  char *pcStack_28;
  int windows_backslashes;
  char *c;
  int size;
  int flags_local;
  int isUnix_local;
  char *in_local;
  
  sVar2 = strlen(in);
  c._4_4_ = (int)sVar2 + 1;
  local_2c = 0;
  pcStack_28 = in;
  while ((*pcStack_28 != '\0' &&
         (((flags & 0x40U) == 0 ||
          (pcStack_28 = kwsysSystem_Shell__SkipMakeVariables(pcStack_28), *pcStack_28 != '\0'))))) {
    if (isUnix == 0) {
      if ((flags & 4U) == 0) {
        if (*pcStack_28 == '\\') {
          local_2c = local_2c + 1;
        }
        else {
          if (*pcStack_28 == '\"') {
            c._4_4_ = local_2c + 1 + c._4_4_;
          }
          local_2c = 0;
        }
      }
    }
    else if ((((*pcStack_28 == '\\') || (*pcStack_28 == '\"')) || (*pcStack_28 == '`')) ||
            (*pcStack_28 == '$')) {
      c._4_4_ = c._4_4_ + 1;
    }
    if (*pcStack_28 == '$') {
      if ((flags & 1U) == 0) {
        if ((flags & 2U) != 0) {
          c._4_4_ = c._4_4_ + 2;
        }
      }
      else {
        c._4_4_ = c._4_4_ + 1;
      }
    }
    else if (*pcStack_28 == '#') {
      if (((flags & 1U) != 0) && ((flags & 8U) != 0)) {
        c._4_4_ = c._4_4_ + 1;
      }
    }
    else if (*pcStack_28 == '%') {
      if (((flags & 2U) != 0) ||
         (((flags & 1U) != 0 && (((flags & 0x10U) != 0 || ((flags & 0x20U) != 0)))))) {
        c._4_4_ = c._4_4_ + 1;
      }
    }
    else if ((*pcStack_28 == ';') && ((flags & 2U) != 0)) {
      c._4_4_ = c._4_4_ + 2;
    }
    pcStack_28 = pcStack_28 + 1;
  }
  iVar1 = kwsysSystem_Shell__ArgumentNeedsQuotes(in,isUnix,flags);
  if (iVar1 != 0) {
    if (((flags & 0x80U) != 0) && (isUnix != 0)) {
      c._4_4_ = c._4_4_ + 2;
    }
    c._4_4_ = local_2c + c._4_4_ + 2;
  }
  return c._4_4_;
}

Assistant:

static int kwsysSystem_Shell__GetArgumentSize(const char* in,
                                              int isUnix, int flags)
{
  /* Start with the length of the original argument, plus one for
     either a terminating null or a separating space.  */
  int size = (int)strlen(in) + 1;

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Scan the string for characters that require escaping or quoting.  */
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
      /* Skip over the make variable references if any are present.  */
      c = kwsysSystem_Shell__SkipMakeVariables(c);

      /* Stop if we have reached the end of the string.  */
      if(!*c)
        {
        break;
        }
      }

    /* Check whether this character needs escaping for the shell.  */
    if(isUnix)
      {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if(*c == '\\' || *c == '"' || *c == '`' || *c == '$')
        {
        /* This character needs a backslash to escape it.  */
        ++size;
        }
      }
    else if(flags & kwsysSystem_Shell_Flag_EchoWindows)
      {
      /* On Windows the built-in command shell echo never needs escaping.  */
      }
    else
      {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if(*c == '\\')
        {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
        }
      else if(*c == '"')
        {
        /* Found a double-quote.  We need to escape it and all
           immediately preceding backslashes.  */
        size += windows_backslashes + 1;
        windows_backslashes = 0;
        }
      else
        {
        /* Found another character.  This eliminates the possibility
           that any immediately preceding backslashes will be
           escaped.  */
        windows_backslashes = 0;
        }
      }

    /* Check whether this character needs escaping for a make tool.  */
    if(*c == '$')
      {
      if(flags & kwsysSystem_Shell_Flag_Make)
        {
        /* In Makefiles a dollar is written $$ so we need one extra
           character.  */
        ++size;
        }
      else if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a dollar is written "$" so we need two extra
           characters.  */
        size += 2;
        }
      }
    else if(*c == '#')
      {
      if((flags & kwsysSystem_Shell_Flag_Make) &&
         (flags & kwsysSystem_Shell_Flag_WatcomWMake))
        {
        /* In Watcom WMake makefiles a pound is written $# so we need
           one extra character.  */
        ++size;
        }
      }
    else if(*c == '%')
      {
      if((flags & kwsysSystem_Shell_Flag_VSIDE) ||
         ((flags & kwsysSystem_Shell_Flag_Make) &&
          ((flags & kwsysSystem_Shell_Flag_MinGWMake) ||
           (flags & kwsysSystem_Shell_Flag_NMake))))
        {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%
           so we need one extra characters.  */
        size += 1;
        }
      }
    else if(*c == ';')
      {
      if(flags & kwsysSystem_Shell_Flag_VSIDE)
        {
        /* In a VS IDE a semicolon is written ";" so we need two extra
           characters.  */
        size += 2;
        }
      }
    }

  /* Check whether the argument needs surrounding quotes.  */
  if(kwsysSystem_Shell__ArgumentNeedsQuotes(in, isUnix, flags))
    {
    /* Surrounding quotes are needed.  Allocate space for them.  */
    if((flags & kwsysSystem_Shell_Flag_WatcomQuote) && (isUnix))
      {
        size += 2;
      }
    size += 2;

    /* We must escape all ending backslashes when quoting on windows.  */
    size += windows_backslashes;
    }

  return size;
}